

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int dumb_it_trim_silent_patterns(DUH *duh)

{
  int iVar1;
  DUMB_IT_SIGDATA *pDVar2;
  IT_PATTERN *pIVar3;
  long in_RDI;
  IT_PATTERN *pattern_1;
  int p_1;
  IT_PATTERN *pattern;
  int p;
  DUMB_IT_SIGDATA *sigdata;
  int n;
  int local_14;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    pDVar2 = duh_get_it_sigdata((DUH *)0x855cf8);
    if (((pDVar2 == (DUMB_IT_SIGDATA *)0x0) || (pDVar2->order == (uchar *)0x0)) ||
       (pDVar2->pattern == (IT_PATTERN *)0x0)) {
      local_4 = -1;
    }
    else {
      for (local_14 = 0; local_14 < pDVar2->n_orders; local_14 = local_14 + 1) {
        if ((int)(uint)pDVar2->order[local_14] < pDVar2->n_patterns) {
          pIVar3 = pDVar2->pattern + (int)(uint)pDVar2->order[local_14];
          iVar1 = is_pattern_silent(pIVar3,local_14);
          if (iVar1 < 2) break;
          pIVar3->n_rows = 1;
          pIVar3->n_entries = 0;
          if (pIVar3->entry != (IT_ENTRY *)0x0) {
            free(pIVar3->entry);
            pIVar3->entry = (IT_ENTRY *)0x0;
          }
        }
      }
      if (local_14 == pDVar2->n_orders) {
        local_4 = -1;
      }
      else {
        local_14 = pDVar2->n_orders;
        while (local_14 = local_14 + -1, -1 < local_14) {
          if ((int)(uint)pDVar2->order[local_14] < pDVar2->n_patterns) {
            pIVar3 = pDVar2->pattern + (int)(uint)pDVar2->order[local_14];
            iVar1 = is_pattern_silent(pIVar3,local_14);
            if (iVar1 < 2) break;
            pIVar3->n_rows = 1;
            pIVar3->n_entries = 0;
            if (pIVar3->entry != (IT_ENTRY *)0x0) {
              free(pIVar3->entry);
              pIVar3->entry = (IT_ENTRY *)0x0;
            }
          }
        }
        if (local_14 < 0) {
          local_4 = -1;
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int DUMBEXPORT dumb_it_trim_silent_patterns(DUH * duh) {
	int n;
	DUMB_IT_SIGDATA *sigdata;

	if (!duh) return -1;

	sigdata = duh_get_it_sigdata(duh);

	if (!sigdata || !sigdata->order || !sigdata->pattern) return -1;

	for (n = 0; n < sigdata->n_orders; n++) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n == sigdata->n_orders) return -1;

	for (n = sigdata->n_orders - 1; n >= 0; n--) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n < 0) return -1;

	/*duh->length = dumb_it_build_checkpoints(sigdata, 0);*/

	return 0;
}